

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

bool __thiscall higan::HttpRequest::SetUrl(HttpRequest *this,char *begin,char *end)

{
  bool bVar1;
  string local_48;
  char *local_28;
  char *end_local;
  char *begin_local;
  HttpRequest *this_local;
  
  bVar1 = 0 < (long)end - (long)begin;
  if (bVar1) {
    local_28 = end;
    end_local = begin;
    begin_local = (char *)this;
    Codec::DecodeUrl_abi_cxx11_(&local_48,(Codec *)begin,end + -(long)begin,(size_t)begin);
    std::__cxx11::string::operator=((string *)&this->url_,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar1;
}

Assistant:

bool HttpRequest::SetUrl(const char* begin, const char* end)
{
	if (end - begin < 1)
	{
		return false;
	}
	url_ = Codec::DecodeUrl(begin, end - begin);

	return true;
}